

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O2

char * sam_hdr_PG_ID(SAM_hdr *sh,char *name)

{
  kh_m_s2i_t *pkVar1;
  khint_t kVar2;
  char *__s;
  
  pkVar1 = sh->pg_hash;
  kVar2 = kh_get_m_s2i(pkVar1,name);
  __s = name;
  if (kVar2 != pkVar1->n_buckets) {
    __s = sh->ID_buf;
    do {
      sh->ID_cnt = sh->ID_cnt + 1;
      sprintf(__s,"%.1000s.%d",name);
      pkVar1 = sh->pg_hash;
      kVar2 = kh_get_m_s2i(pkVar1,__s);
    } while (kVar2 == pkVar1->n_buckets);
  }
  return __s;
}

Assistant:

const char *sam_hdr_PG_ID(SAM_hdr *sh, const char *name) {
    khint_t k = kh_get(m_s2i, sh->pg_hash, name);
    if (k == kh_end(sh->pg_hash))
	return name;

    do {
	sprintf(sh->ID_buf, "%.1000s.%d", name, sh->ID_cnt++);
	k = kh_get(m_s2i, sh->pg_hash, sh->ID_buf);
    } while (k == kh_end(sh->pg_hash));

    return sh->ID_buf;
}